

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.hpp
# Opt level: O2

void __thiscall
de::ArrayBuffer<int,_64UL,_4UL>::ArrayBuffer(ArrayBuffer<int,_64UL,_4UL> *this,size_t numElements)

{
  void *pvVar1;
  
  this->m_ptr = (void *)0x0;
  this->m_cap = 0;
  if (numElements != 0) {
    pvVar1 = detail::ArrayBuffer_AlignedMalloc(numElements * 4,0x40);
    this->m_ptr = pvVar1;
    this->m_cap = numElements;
  }
  return;
}

Assistant:

ArrayBuffer<T,Alignment,Stride>::ArrayBuffer (size_t numElements)
	: m_ptr	(DE_NULL)
	, m_cap	(0)
{
	if (numElements)
	{
		// \note no need to allocate stride for the last element, sizeof(T) is enough. Also handles cases where sizeof(T) > Stride
		const size_t	storageSize	= (numElements - 1) * Stride + sizeof(T);
		void* const		ptr			= detail::ArrayBuffer_AlignedMalloc(storageSize, Alignment);

		if (!ptr)
			throw std::bad_alloc();

		m_ptr = ptr;
		m_cap = numElements;
	}
}